

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kf_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_46c44b::ForcedKeyTestLarge::Frame1IsKey(ForcedKeyTestLarge *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined4 uVar4;
  long in_RDI;
  AssertionResult gtest_ar;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  I420VideoSource video;
  int i;
  int is_realtime;
  int lag_values [2] [3];
  aom_rational timebase;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe94;
  bool *in_stack_fffffffffffffe98;
  Message *in_stack_fffffffffffffea0;
  Message *in_stack_fffffffffffffea8;
  Message *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  Type in_stack_fffffffffffffebc;
  undefined2 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec2;
  undefined1 in_stack_fffffffffffffec3;
  uint start;
  allocator *paVar6;
  AssertionResult local_108;
  Message *in_stack_ffffffffffffff08;
  AssertHelper *in_stack_ffffffffffffff10;
  Type local_e4;
  HasNewFatalFailureHelper local_e0;
  allocator local_b1;
  string local_b0 [32];
  undefined1 local_90 [96];
  int local_30;
  uint local_2c;
  int local_28 [10];
  
  local_28[6] = 1;
  local_28[7] = 0x1e;
  local_28[0] = 3;
  local_28[1] = 0xf;
  local_28[2] = 0x19;
  local_28[3] = 0;
  local_28[4] = -1;
  local_28[5] = -1;
  local_2c = (uint)(*(int *)(in_RDI + 0x3f4) == 0);
  *(undefined4 *)(in_RDI + 0x408) = 1;
  local_30 = 0;
  do {
    if (2 < local_30) {
      return;
    }
    if (local_28[(long)(int)local_2c * 3 + (long)local_30] != -1) {
      *(undefined4 *)(in_RDI + 0x40c) = 0;
      *(int *)(in_RDI + 0x68) = local_28[(long)(int)local_2c * 3 + (long)local_30];
      *(undefined1 *)(in_RDI + 0x410) = 0;
      pcVar3 = TestFileName();
      paVar6 = &local_b1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,pcVar3,paVar6);
      start = (uint)paVar6;
      iVar2 = TestFileWidth();
      TestFileHeight();
      uVar4 = 0x1e;
      if (*(int *)(in_RDI + 0x3fc) != 0) {
        uVar4 = 0x3c;
      }
      uVar5 = 0;
      libaom_test::I420VideoSource::I420VideoSource
                ((I420VideoSource *)
                 CONCAT44(iVar2,CONCAT13(in_stack_fffffffffffffec3,
                                         CONCAT12(in_stack_fffffffffffffec2,
                                                  in_stack_fffffffffffffec0))),
                 (string *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                 (uint)((ulong)in_stack_fffffffffffffeb0 >> 0x20),(uint)in_stack_fffffffffffffeb0,
                 (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),(int)in_stack_fffffffffffffea8,
                 start,(int)in_RDI);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      in_stack_fffffffffffffec3 = testing::internal::AlwaysTrue();
      if ((bool)in_stack_fffffffffffffec3) {
        testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                  ((HasNewFatalFailureHelper *)
                   CONCAT44(iVar2,CONCAT13(in_stack_fffffffffffffec3,
                                           CONCAT12(in_stack_fffffffffffffec2,
                                                    in_stack_fffffffffffffec0))));
        in_stack_fffffffffffffec2 = testing::internal::AlwaysTrue();
        if ((bool)in_stack_fffffffffffffec2) {
          (**(code **)(*(long *)(in_RDI + 0x18) + 0x10))(in_RDI + 0x18,local_90);
        }
        bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure(&local_e0);
        if (bVar1) {
          local_e4 = 5;
        }
        else {
          local_e4 = kSuccess;
        }
        testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                  ((HasNewFatalFailureHelper *)CONCAT44(in_stack_fffffffffffffe94,uVar4));
        if (local_e4 == kSuccess) {
          testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                    ((char *)in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0,
                     in_stack_fffffffffffffe98,(bool *)CONCAT44(in_stack_fffffffffffffe94,uVar4));
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_108);
          in_stack_fffffffffffffebc = local_e4;
          if (!bVar1) {
            testing::Message::Message
                      ((Message *)
                       CONCAT44(iVar2,CONCAT13(in_stack_fffffffffffffec3,
                                               CONCAT12(in_stack_fffffffffffffec2,
                                                        in_stack_fffffffffffffec0))));
            in_stack_fffffffffffffeb0 =
                 testing::Message::operator<<
                           ((Message *)CONCAT44(in_stack_fffffffffffffe94,uVar4),
                            (char (*) [8])CONCAT44(in_stack_fffffffffffffe8c,uVar5));
            in_stack_fffffffffffffea8 =
                 testing::Message::operator<<
                           ((Message *)CONCAT44(in_stack_fffffffffffffe94,uVar4),
                            (uint *)CONCAT44(in_stack_fffffffffffffe8c,uVar5));
            in_stack_fffffffffffffea0 =
                 testing::Message::operator<<
                           ((Message *)CONCAT44(in_stack_fffffffffffffe94,uVar4),
                            (char (*) [19])CONCAT44(in_stack_fffffffffffffe8c,uVar5));
            in_stack_fffffffffffffe98 =
                 (bool *)testing::AssertionResult::failure_message((AssertionResult *)0x57a892);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)
                       CONCAT44(iVar2,CONCAT13(in_stack_fffffffffffffec3,
                                               CONCAT12(in_stack_fffffffffffffec2,
                                                        in_stack_fffffffffffffec0))),local_e4,
                       (char *)in_stack_fffffffffffffeb0,
                       (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                       (char *)in_stack_fffffffffffffea0);
            testing::internal::AssertHelper::operator=
                      (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe94,uVar4));
            testing::Message::~Message((Message *)0x57a8e0);
            in_stack_fffffffffffffebc = local_e4;
          }
          local_e4 = (Type)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x57a95b);
          if (local_e4 == kSuccess) {
            local_e4 = kSuccess;
          }
        }
        else {
          in_stack_fffffffffffffebc = local_e4;
          if (local_e4 == 5) goto LAB_0057a72a;
        }
      }
      else {
LAB_0057a72a:
        testing::Message::Message
                  ((Message *)
                   CONCAT44(iVar2,CONCAT13(in_stack_fffffffffffffec3,
                                           CONCAT12(in_stack_fffffffffffffec2,
                                                    in_stack_fffffffffffffec0))));
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)
                   CONCAT44(iVar2,CONCAT13(in_stack_fffffffffffffec3,
                                           CONCAT12(in_stack_fffffffffffffec2,
                                                    in_stack_fffffffffffffec0))),
                   in_stack_fffffffffffffebc,(char *)in_stack_fffffffffffffeb0,
                   (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),(char *)in_stack_fffffffffffffea0
                  );
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe94,uVar4));
        testing::Message::~Message((Message *)0x57a791);
        local_e4 = kNonFatalFailure;
      }
      libaom_test::I420VideoSource::~I420VideoSource((I420VideoSource *)0x57a980);
      if (local_e4 != kSuccess) {
        return;
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

void ForcedKeyTestLarge::Frame1IsKey() {
  const aom_rational timebase = { 1, 30 };
  // 1st element of this 2D array is for good encoding mode and 2nd element
  // is for RT encoding mode.
  const int lag_values[2][NUM_LAG_VALUES] = { { 3, 15, 25 }, { 0, -1, -1 } };
  int is_realtime = (encoding_mode_ == ::libaom_test::kRealTime);

  forced_kf_frame_num_ = 1;
  for (int i = 0; i < NUM_LAG_VALUES; ++i) {
    if (lag_values[is_realtime][i] == -1) continue;
    frame_num_ = 0;
    cfg_.g_lag_in_frames = lag_values[is_realtime][i];
    is_kf_placement_violated_ = false;
    libaom_test::I420VideoSource video(
        TestFileName(), TestFileWidth(), TestFileHeight(), timebase.den,
        timebase.num, 0, fwd_kf_enabled_ ? 60 : 30);
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    ASSERT_EQ(is_kf_placement_violated_, false)
        << "Frame #" << frame_num_ << " isn't a keyframe!";
  }
}